

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::writeOutfile(QPDFJob *this,QPDF *pdf)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  Pipeline *pPVar4;
  size_t in_RCX;
  void *__buf;
  QPDFWriter *w_00;
  element_type *peVar5;
  allocator<char> local_a9;
  QPDFWriter w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  shared_ptr<char> temp_out;
  __shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> local_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5->replace_input == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               (peVar5->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_a9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,&local_88
                   ,".~qpdf-temp#");
    QUtil::make_shared_cstr((QUtil *)&local_50,(string *)&w);
    std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__cxx11::string::~string((string *)&w);
    std::__cxx11::string::~string((string *)&local_88);
    std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
               &temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    pcVar1 = (peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((*pcVar1 == '-') && (pcVar1[1] == '\0')) {
      w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&w);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      json_version == 0) {
    QPDFWriter::QPDFWriter(&w,pdf);
    peVar5 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar1 = (peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pcVar1 == (char *)0x0) {
      QPDFLogger::saveToStandardOutput
                ((peVar5->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 true);
      QPDFLogger::getSave((QPDFLogger *)&local_88,
                          SUB81((((this->m).
                                  super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      QPDFWriter::setOutputPipeline(&w,(Pipeline *)local_88._M_dataplus._M_p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    }
    else {
      QPDFWriter::setOutputFilename(&w,pcVar1);
    }
    w_00 = &w;
    setWriterOptions(this,w_00);
    QPDFWriter::write(&w,(int)w_00,__buf,in_RCX);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  else {
    writeJSON(this,pdf);
  }
  peVar5 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:3111:21)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:3111:21)>
               ::_M_manager;
    local_40._M_unused._M_object = this;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_40);
    std::_Function_base::~_Function_base((_Function_base *)&local_40);
    peVar5 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  bVar2 = peVar5->replace_input;
  if ((bool)bVar2 == true) {
    w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    bVar2 = ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            replace_input;
  }
  if ((bVar2 & 1) != 0) {
    QPDF::closeInputSource(pdf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (allocator<char> *)&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,&local_88
                   ,".~qpdf-orig");
    std::__cxx11::string::~string((string *)&local_88);
    bVar3 = QPDF::anyWarnings(pdf);
    if (!bVar3) {
      std::__cxx11::string::append((ulong)&w,'\x01');
    }
    QUtil::rename_file((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(char *)w.m.
                                      super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
    QUtil::rename_file(temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (bVar3) {
      QPDFLogger::getError
                ((QPDFLogger *)&local_88,
                 SUB81((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,0));
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)local_88._M_dataplus._M_p,
                          &((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->message_prefix);
      pPVar4 = Pipeline::operator<<(pPVar4,": there are warnings; original file kept in ");
      pPVar4 = Pipeline::operator<<(pPVar4,(string *)&w);
      Pipeline::operator<<(pPVar4,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    }
    else {
      QUtil::remove_file((char *)w.m.
                                 super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
    }
    std::__cxx11::string::~string((string *)&w);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFJob::writeOutfile(QPDF& pdf)
{
    std::shared_ptr<char> temp_out;
    if (m->replace_input) {
        // Append but don't prepend to the path to generate a temporary name. This saves us from
        // having to split the path by directory and non-directory.
        temp_out = QUtil::make_shared_cstr(std::string(m->infilename.get()) + ".~qpdf-temp#");
        // m->outfilename will be restored to 0 before temp_out goes out of scope.
        m->outfilename = temp_out;
    } else if (strcmp(m->outfilename.get(), "-") == 0) {
        m->outfilename = nullptr;
    }
    if (m->json_version) {
        writeJSON(pdf);
    } else {
        // QPDFWriter must have block scope so the output file will be closed after write()
        // finishes.
        QPDFWriter w(pdf);
        if (m->outfilename) {
            w.setOutputFilename(m->outfilename.get());
        } else {
            // saveToStandardOutput has already been called, but calling it again is defensive and
            // harmless.
            m->log->saveToStandardOutput(true);
            w.setOutputPipeline(m->log->getSave().get());
        }
        setWriterOptions(w);
        w.write();
    }
    if (m->outfilename) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": wrote file " << m->outfilename.get() << "\n";
        });
    }
    if (m->replace_input) {
        m->outfilename = nullptr;
    }
    if (m->replace_input) {
        // We must close the input before we can rename files
        pdf.closeInputSource();
        std::string backup = std::string(m->infilename.get()) + ".~qpdf-orig";
        bool warnings = pdf.anyWarnings();
        if (!warnings) {
            backup.append(1, '#');
        }
        QUtil::rename_file(m->infilename.get(), backup.c_str());
        QUtil::rename_file(temp_out.get(), m->infilename.get());
        if (warnings) {
            *m->log->getError() << m->message_prefix
                                << ": there are warnings; original file kept in " << backup << "\n";
        } else {
            try {
                QUtil::remove_file(backup.c_str());
            } catch (QPDFSystemError& e) {
                *m->log->getError() << m->message_prefix << ": unable to delete original file ("
                                    << e.what() << ");" << " original file left in " << backup
                                    << ", but the input was successfully replaced\n";
            }
        }
    }
}